

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finite.h
# Opt level: O3

void __thiscall Finite::Finite(Finite *this,BigInteger *n)

{
  compare_t cVar1;
  BigInteger local_128;
  BigInteger local_108;
  BigInteger local_e8;
  BigInteger local_c8;
  BigInteger local_a8;
  BigInteger local_88;
  BigInteger local_68;
  BigInteger local_48;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,&n->digits);
  (this->val).negative = n->negative;
  cVar1 = BigInteger::_compare(&this->val,&_FINITE_ORDER);
  if (cVar1 != CMP_LESS) {
    BigInteger::operator%=(&this->val,&_FINITE_ORDER);
  }
  BigInteger::BigInteger(&local_128,0);
  cVar1 = BigInteger::_compare(&this->val,&local_128);
  if (local_128.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (cVar1 == CMP_LESS) {
    BigInteger::BigInteger(&local_a8,0);
    ::operator-(&local_88,&local_a8,&this->val);
    BigInteger::BigInteger(&local_c8,1);
    ::operator-(&local_68,&local_88,&local_c8);
    operator%(&local_108,&local_68,&_FINITE_ORDER);
    BigInteger::BigInteger(&local_e8,1);
    ::operator+(&local_48,&local_108,&local_e8);
    ::operator-(&local_128,&_FINITE_ORDER,&local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,&local_128.digits);
    (this->val).negative = local_128.negative;
    if (local_128.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_108.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_68.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_c8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

Finite(const BigInteger &n): val(n)
    {
        if(val >= _FINITE_ORDER)
            val %= _FINITE_ORDER;
        if(val < 0)
            val = _FINITE_ORDER - ((0ll - val - 1) % _FINITE_ORDER + 1);
    }